

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O0

void __thiscall
EthBasePort::make_qwrite_packet
          (EthBasePort *this,quadlet_t *packet,nodeid_t node,nodeaddr_t addr,quadlet_t data,uint tl)

{
  __uint32_t _Var1;
  uint32_t uVar2;
  uint tl_local;
  quadlet_t data_local;
  nodeaddr_t addr_local;
  nodeid_t node_local;
  quadlet_t *packet_local;
  EthBasePort *this_local;
  
  make_1394_header(this,packet,node,addr,0,tl);
  _Var1 = __bswap_32(data);
  packet[3] = _Var1;
  uVar2 = crc32(0,packet,0x10);
  uVar2 = BitReverse32(uVar2);
  _Var1 = __bswap_32(uVar2);
  packet[4] = _Var1;
  return;
}

Assistant:

void EthBasePort::make_qwrite_packet(quadlet_t *packet, nodeid_t node, nodeaddr_t addr, quadlet_t data, unsigned int tl)
{
    make_1394_header(packet, node, addr, EthBasePort::QWRITE, tl);
    // quadlet data
    packet[3] = bswap_32(data);
    // CRC
    packet[4] = bswap_32(BitReverse32(crc32(0U, (void*)packet, FW_QWRITE_SIZE-FW_CRC_SIZE)));
}